

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-netcdf-cursor.c
# Opt level: O0

int read_basic_type(coda_cursor *cursor,void *dst,long size_boundary)

{
  coda_dynamic_type_struct *pcVar1;
  coda_product_struct *pcVar2;
  coda_dynamic_type_struct *pcVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long record_index;
  long num_sub_elements;
  coda_netcdf_array *array;
  int64_t byte_size;
  int64_t offset;
  coda_netcdf_product *product;
  coda_netcdf_basic_type *type;
  long size_boundary_local;
  void *dst_local;
  coda_cursor *cursor_local;
  
  pcVar1 = cursor->stack[cursor->n + -1].type;
  pcVar2 = cursor->product;
  byte_size = (int64_t)pcVar1[1].definition;
  lVar5 = pcVar1->definition->bit_size >> 3;
  if (((cursor->stack[cursor->n + -2].type)->backend == coda_backend_netcdf) &&
     ((cursor->stack[cursor->n + -2].type)->definition->type_class == coda_array_class)) {
    if (pcVar1[2].backend == coda_backend_ascii) {
      byte_size = (long)&((coda_type *)byte_size)->format +
                  cursor->stack[cursor->n + -1].index * lVar5;
    }
    else {
      pcVar3 = cursor->stack[cursor->n + -2].type;
      lVar6 = *(long *)&pcVar3->definition[1].type_class / (long)pcVar3->definition[1].description;
      lVar7 = cursor->stack[cursor->n + -1].index / lVar6;
      byte_size = (long)&((coda_type *)byte_size)->format +
                  (cursor->stack[cursor->n + -1].index - lVar7 * lVar6) * lVar5 +
                  lVar7 * *(long *)&pcVar2[1].format;
    }
  }
  if ((size_boundary < 0) || (lVar5 <= size_boundary)) {
    iVar4 = read_bytes((coda_product *)pcVar2[1].filename,byte_size,lVar5,dst);
    if (iVar4 != 0) {
      return -1;
    }
  }
  else {
    iVar4 = read_bytes((coda_product *)pcVar2[1].filename,byte_size,size_boundary,dst);
    if (iVar4 != 0) {
      return -1;
    }
  }
  if (((pcVar1->definition->type_class == coda_integer_class) ||
      (pcVar1->definition->type_class == coda_real_class)) &&
     (lVar5 = pcVar1->definition->bit_size, lVar5 != 8)) {
    if (lVar5 == 0x10) {
      swap2(dst);
    }
    else if (lVar5 == 0x20) {
      swap4(dst);
    }
    else {
      if (lVar5 != 0x40) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-netcdf-cursor.c"
                      ,0x1a6,"int read_basic_type(const coda_cursor *, void *, long)");
      }
      swap8(dst);
    }
  }
  return 0;
}

Assistant:

static int read_basic_type(const coda_cursor *cursor, void *dst, long size_boundary)
{
    coda_netcdf_basic_type *type;
    coda_netcdf_product *product;
    int64_t offset;
    int64_t byte_size;

    type = (coda_netcdf_basic_type *)cursor->stack[cursor->n - 1].type;
    product = (coda_netcdf_product *)cursor->product;
    offset = type->offset;
    byte_size = type->definition->bit_size >> 3;

    if (cursor->stack[cursor->n - 2].type->backend == coda_backend_netcdf &&
        cursor->stack[cursor->n - 2].type->definition->type_class == coda_array_class)
    {
        if (type->record_var)
        {
            coda_netcdf_array *array = (coda_netcdf_array *)cursor->stack[cursor->n - 2].type;
            long num_sub_elements;
            long record_index;

            num_sub_elements = array->definition->num_elements / array->definition->dim[0];
            record_index = cursor->stack[cursor->n - 1].index / num_sub_elements;
            /* jump to record */
            offset += record_index * product->record_size;
            /* jump to sub element in record */
            offset += (cursor->stack[cursor->n - 1].index - record_index * num_sub_elements) * byte_size;
        }
        else
        {
            offset += cursor->stack[cursor->n - 1].index * byte_size;
        }
    }

    if (size_boundary >= 0 && byte_size > size_boundary)
    {
        if (read_bytes(product->raw_product, offset, size_boundary, dst) != 0)
        {
            return -1;
        }
    }
    else
    {
        if (read_bytes(product->raw_product, offset, byte_size, dst) != 0)
        {
            return -1;
        }
    }

#ifndef WORDS_BIGENDIAN
    if (type->definition->type_class == coda_integer_class || type->definition->type_class == coda_real_class)
    {
        switch (type->definition->bit_size)
        {
            case 8:
                /* no endianness conversion needed */
                break;
            case 16:
                swap2(dst);
                break;
            case 32:
                swap4(dst);
                break;
            case 64:
                swap8(dst);
                break;
            default:
                assert(0);
                exit(1);
        }
    }
#endif

    return 0;
}